

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)

{
  long lVar1;
  PHYSFS_sint64 retval;
  PHYSFS_sint64 local_10;
  
  if (handle->opaque == (void *)0x0) {
    if ((magicStream == (FileHandle *)0x0) || (magicStream->forReading == '\0')) {
      local_10 = 0;
    }
    else {
      PHYSFS_readBytes((PHYSFS_File *)magicStream,&local_10,8);
    }
  }
  else {
    lVar1 = (**(code **)((long)handle->opaque + 0x28))();
    if (*(char *)&handle[1].opaque == '\0') {
      local_10 = lVar1 + (long)handle[5].opaque;
    }
    else {
      local_10 = (lVar1 - (long)handle[5].opaque) + (long)handle[6].opaque;
    }
    if ((magicStream != (FileHandle *)0x0) && (magicStream->forReading == '\0')) {
      PHYSFS_writeBytes((PHYSFS_File *)magicStream,&local_10,8);
    }
  }
  return local_10;
}

Assistant:

PHYSFS_sint64 PHYSFS_tell(PHYSFS_File *handle)
{
    FileHandle *fh = (FileHandle *) handle;
    PHYSFS_sint64 pos;
    PHYSFS_sint64 retval;

    if (fh->io == NULL)
    {
        if (magicStream && magicStream->forReading)
        {
            PHYSFS_sint64 retval;
            PHYSFS_readBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));
            return retval;
        } /* if */
        return 0; /* magic stream opened file but no magic stream open */
    } /* if */

    pos = fh->io->tell(fh->io);
    retval = fh->forReading ?
             (pos - fh->buffill) + fh->bufpos :
             (pos + fh->buffill);

    if (magicStream && !magicStream->forReading)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, &retval, sizeof(PHYSFS_sint64));

    return retval;
}